

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_histogram.cpp
# Opt level: O2

void Omega_h::render_histogram_matplotlib(Histogram *histogram,string *filepath)

{
  double dVar1;
  pointer plVar2;
  pointer plVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double local_250;
  ofstream script;
  
  std::ofstream::ofstream((ostream *)&script,"Omega_h_histogram.py",_S_out);
  std::operator<<((ostream *)&script,"#!/usr/bin/python\n");
  std::operator<<((ostream *)&script,"import matplotlib\n");
  std::operator<<((ostream *)&script,"# Force matplotlib to not use any Xwindows backend.\n");
  std::operator<<((ostream *)&script,"matplotlib.use(\'Agg\')\n");
  std::operator<<((ostream *)&script,"import matplotlib.pyplot as plt\n");
  plVar2 = (histogram->bins).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  plVar3 = (histogram->bins).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar10 = histogram->max;
  dVar1 = histogram->min;
  std::operator<<((ostream *)&script,"a = [");
  uVar9 = (ulong)((long)plVar2 - (long)plVar3) >> 3;
  iVar4 = (int)uVar9;
  dVar10 = (dVar10 - dVar1) / (double)iVar4;
  uVar8 = 0;
  uVar7 = 0;
  if (0 < iVar4) {
    uVar7 = uVar9 & 0xffffffff;
  }
  lVar6 = 0;
  for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    std::ostream::_M_insert<double>((double)(int)uVar8 * dVar10 + histogram->min + dVar10 * 0.5);
    if ((int)uVar8 + 1 < iVar4) {
      std::operator<<((ostream *)&script,", ");
    }
    lVar6 = lVar6 + (histogram->bins).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar8];
  }
  std::operator<<((ostream *)&script,"]\n");
  std::operator<<((ostream *)&script,"b = [");
  local_250 = 0.0;
  for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    dVar10 = ((double)(histogram->bins).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar8] / (double)lVar6) * 100.0;
    std::ostream::_M_insert<double>(dVar10);
    if ((int)uVar8 + 1 < iVar4) {
      std::operator<<((ostream *)&script,", ");
    }
    if (local_250 <= dVar10) {
      local_250 = dVar10;
    }
  }
  std::operator<<((ostream *)&script,"]\n");
  std::operator<<((ostream *)&script,"fig = plt.figure(figsize=(3,2))\n");
  std::operator<<((ostream *)&script,"ax = fig.add_subplot(111)\n");
  std::operator<<((ostream *)&script,"ax.set_autoscale_on(False)\n");
  poVar5 = std::operator<<((ostream *)&script,"ax.hist(a, ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar4);
  std::operator<<(poVar5,", weights=b");
  std::operator<<((ostream *)&script,", range=(");
  poVar5 = std::ostream::_M_insert<double>(histogram->min);
  std::operator<<(poVar5,", ");
  poVar5 = std::ostream::_M_insert<double>(histogram->max);
  std::operator<<(poVar5,")");
  std::operator<<((ostream *)&script,")\n");
  std::operator<<((ostream *)&script,"ax.axis([");
  poVar5 = std::ostream::_M_insert<double>(histogram->min);
  std::operator<<(poVar5,", ");
  poVar5 = std::ostream::_M_insert<double>(histogram->max);
  std::operator<<(poVar5,", ");
  std::operator<<((ostream *)&script,"0, ");
  poVar5 = std::ostream::_M_insert<double>(local_250);
  std::operator<<(poVar5,"])\n");
  poVar5 = std::operator<<((ostream *)&script,"fig.savefig(\'");
  poVar5 = std::operator<<(poVar5,(string *)filepath);
  std::operator<<(poVar5,"\', bbox_inches=\'tight\')\n");
  std::ofstream::close();
  iVar4 = system("python Omega_h_histogram.py");
  if (iVar4 == 0) {
    std::ofstream::~ofstream(&script);
    return;
  }
  fail("assertion %s failed at %s +%d\n","ret == 0",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_histogram.cpp"
       ,0x7e);
}

Assistant:

void render_histogram_matplotlib(
    Histogram const& histogram, std::string const& filepath) {
  std::ofstream script("Omega_h_histogram.py");
  script << "#!/usr/bin/python\n";
  script << "import matplotlib\n";
  script << "# Force matplotlib to not use any Xwindows backend.\n";
  script << "matplotlib.use('Agg')\n";
  script << "import matplotlib.pyplot as plt\n";
  auto nbins = Int(histogram.bins.size());
  auto interval = (histogram.max - histogram.min) / Real(nbins);
  script << "a = [";
  GO total = 0;
  for (Int i = 0; i < nbins; ++i) {
    auto mid = (interval * i) + histogram.min + (interval / 2.0);
    script << mid;
    if (i + 1 < nbins) script << ", ";
    total += histogram.bins[std::size_t(i)];
  }
  script << "]\n";
  script << "b = [";
  Real max_percent = 0.0;
  for (Int i = 0; i < nbins; ++i) {
    auto percent = (Real(histogram.bins[std::size_t(i)]) / Real(total)) * 100.0;
    max_percent = max2(percent, max_percent);
    script << percent;
    if (i + 1 < nbins) script << ", ";
  }
  script << "]\n";
  script << "fig = plt.figure(figsize=(3,2))\n";
  script << "ax = fig.add_subplot(111)\n";
  script << "ax.set_autoscale_on(False)\n";
  script << "ax.hist(a, " << nbins << ", weights=b";
  script << ", range=(" << histogram.min << ", " << histogram.max << ")";
  script << ")\n";
  script << "ax.axis([" << histogram.min << ", " << histogram.max << ", ";
  script << "0, " << max_percent << "])\n";
  script << "fig.savefig('" << filepath << "', bbox_inches='tight')\n";
  script.close();
  int ret = ::system("python Omega_h_histogram.py");
  OMEGA_H_CHECK(ret == 0);
}